

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void show_string(descriptor_data *d,char *input)

{
  char cVar1;
  long in_RDI;
  int show_lines;
  int toggle;
  int lines;
  char *chk;
  char *scan;
  char buf [4608];
  char buffer [18432];
  char *in_stack_ffffffffffffa5a8;
  char *in_stack_ffffffffffffa5b0;
  undefined8 in_stack_ffffffffffffa5c0;
  int length;
  undefined4 in_stack_ffffffffffffa5c8;
  int iVar2;
  int iVar3;
  int iVar4;
  char *local_5a28;
  char *local_5a20;
  char local_5a18;
  char local_4818 [18448];
  long local_8;
  
  length = (int)((ulong)in_stack_ffffffffffffa5c0 >> 0x20);
  iVar4 = 0;
  iVar3 = 1;
  local_8 = in_RDI;
  one_argument(in_stack_ffffffffffffa5b0,in_stack_ffffffffffffa5a8);
  if (local_5a18 != '\0') {
    if (*(long *)(local_8 + 0x6c50) != 0) {
      if (*(void **)(local_8 + 0x6c50) != (void *)0x0) {
        operator_delete__(*(void **)(local_8 + 0x6c50));
      }
      *(undefined8 *)(local_8 + 0x6c50) = 0;
    }
    *(undefined8 *)(local_8 + 0x6c58) = 0;
    return;
  }
  if (*(long *)(local_8 + 0x10) == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = *(int *)(*(long *)(local_8 + 0x10) + 0x140);
  }
  local_5a20 = local_4818;
  do {
    cVar1 = **(char **)(local_8 + 0x6c58);
    *local_5a20 = cVar1;
    if (((cVar1 == '\n') || (*local_5a20 == '\r')) && (iVar3 = -iVar3, iVar3 < 0)) {
      iVar4 = iVar4 + 1;
    }
    else if ((*local_5a20 == '\0') || ((0 < iVar2 && (iVar2 <= iVar4)))) {
      *local_5a20 = '\0';
      strlen(local_4818);
      write_to_buffer((DESCRIPTOR_DATA *)CONCAT44(iVar4,iVar3),
                      (char *)CONCAT44(iVar2,in_stack_ffffffffffffa5c8),length);
      local_5a28 = *(char **)(local_8 + 0x6c58);
      while (iVar3 = isspace((int)*local_5a28), iVar3 != 0) {
        local_5a28 = local_5a28 + 1;
      }
      if (*local_5a28 != '\0') {
        return;
      }
      if (*(long *)(local_8 + 0x6c50) != 0) {
        if (*(void **)(local_8 + 0x6c50) != (void *)0x0) {
          operator_delete__(*(void **)(local_8 + 0x6c50));
        }
        *(undefined8 *)(local_8 + 0x6c50) = 0;
      }
      *(undefined8 *)(local_8 + 0x6c58) = 0;
      return;
    }
    local_5a20 = local_5a20 + 1;
    *(long *)(local_8 + 0x6c58) = *(long *)(local_8 + 0x6c58) + 1;
  } while( true );
}

Assistant:

void show_string(struct descriptor_data *d, char *input)
{
	char buffer[4 * MAX_STRING_LENGTH];
	char buf[MAX_INPUT_LENGTH];
	char *scan, *chk;
	int lines = 0, toggle = 1;
	int show_lines;

	one_argument(input, buf);
	if (buf[0] != '\0')
	{
		if (d->showstr_head)
		{
			delete[] d->showstr_head;
			d->showstr_head = 0;
		}

		d->showstr_point = 0;
		return;
	}

	if (d->character)
		show_lines = d->character->lines;
	else
		show_lines = 0;

	for (scan = buffer;; scan++, d->showstr_point++)
	{
		if (((*scan = *d->showstr_point) == '\n' || *scan == '\r') && (toggle = -toggle) < 0)
		{
			lines++;
		}
		else if (!*scan || (show_lines > 0 && lines >= show_lines))
		{
			*scan = '\0';
			write_to_buffer(d, buffer, strlen(buffer));
			for (chk = d->showstr_point; isspace(*chk); chk++);
			{
				if (!*chk)
				{
					if (d->showstr_head)
					{
						delete[] d->showstr_head;
						d->showstr_head = 0;
					}
					d->showstr_point = 0;
				}
			}

			return;
		}
	}
}